

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar3 = (uint)potential_above->Flags >> 0x19 & 1;
  uVar4 = (uint)potential_below->Flags >> 0x19 & 1;
  if (uVar3 != uVar4) {
    return uVar4 < uVar3;
  }
  lVar5 = (long)(GImGui->Windows).Size;
  do {
    if (lVar5 < 1) {
      return false;
    }
    pIVar1 = (GImGui->Windows).Data[lVar5 + -1];
    bVar2 = (bool)((byte)uVar3 & pIVar1 != potential_below | pIVar1 == potential_above);
    uVar3 = (uint)bVar2;
  } while ((pIVar1 != potential_below) && (lVar5 = lVar5 + -1, pIVar1 != potential_above));
  return bVar2;
}

Assistant:

static inline int GetWindowDisplayLayer(ImGuiWindow* window)
{
    return (window->Flags & ImGuiWindowFlags_Tooltip) ? 1 : 0;
}